

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

Float __thiscall
pbrt::PortalImageInfiniteLight::PDF_Li
          (PortalImageInfiniteLight *this,LightSampleContext ctx,Vector3f w,LightSamplingMode mode)

{
  Point2<float> *p;
  Bounds2<float> *b;
  Float FVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  Point3f PVar4;
  Float duv_dw;
  float local_48;
  float local_44;
  undefined1 local_40 [12];
  optional<pbrt::Bounds2<float>_> local_34;
  Tuple3<pbrt::Point3,_float> local_20;
  
  ImageFromRender((PortalImageInfiniteLight *)local_40,w,(Float *)this);
  local_48 = 0.0;
  if (local_40[8] == true) {
    auVar3 = (undefined1  [56])0x0;
    if ((local_44 != 0.0) || (NAN(local_44))) {
      PVar4 = LightSampleContext::p(&ctx);
      local_20.z = PVar4.super_Tuple3<pbrt::Point3,_float>.z;
      auVar2._0_8_ = PVar4.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar2._8_56_ = auVar3;
      local_20._0_8_ = vmovlps_avx(auVar2._0_16_);
      ImageBounds(&local_34,this,(Point3f *)&local_20);
      local_48 = 0.0;
      if (local_34.set != false) {
        p = pstd::optional<pbrt::Point2<float>_>::value((optional<pbrt::Point2<float>_> *)local_40);
        b = pstd::optional<pbrt::Bounds2<float>_>::value(&local_34);
        FVar1 = WindowedPiecewiseConstant2D::PDF(&this->distribution,p,b);
        local_48 = FVar1 / local_44;
      }
      pstd::optional<pbrt::Bounds2<float>_>::~optional(&local_34);
    }
  }
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)local_40);
  return local_48;
}

Assistant:

Float PortalImageInfiniteLight::PDF_Li(LightSampleContext ctx, Vector3f w,
                                       LightSamplingMode mode) const {
    // Find image $(u,v)$ coordinates corresponding to direction _w_
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);
    if (!uv || duv_dw == 0)
        return 0;

    // Return PDF for sampling $(u,v)$ from reference point
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float pdf = distribution.PDF(*uv, *b);
    return pdf / duv_dw;
}